

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaitaistream.cpp
# Opt level: O2

string * __thiscall
kaitai::kstream::read_bytes_abi_cxx11_(string *__return_storage_ptr__,kstream *this,streamsize len)

{
  runtime_error *this_00;
  allocator_type local_31;
  vector<char,_std::allocator<char>_> result;
  
  std::vector<char,_std::allocator<char>_>::vector(&result,len,&local_31);
  if (-1 < len) {
    if (len != 0) {
      std::istream::read((char *)this->m_io,
                         (long)result.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
              ((string *)__return_storage_ptr__,
               result.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,
               result.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&result.super__Vector_base<char,_std::allocator<char>_>);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"read_bytes: requested a negative amount");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string kaitai::kstream::read_bytes(std::streamsize len) {
    std::vector<char> result(len);

    // NOTE: streamsize type is signed, negative values are only *supposed* to not be used.
    // http://en.cppreference.com/w/cpp/io/streamsize
    if (len < 0) {
        throw std::runtime_error("read_bytes: requested a negative amount");
    }

    if (len > 0) {
        m_io->read(&result[0], len);
    }

    return std::string(result.begin(), result.end());
}